

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRAMAddr.cpp
# Opt level: O2

void * __thiscall DRAMAddr::to_virt(DRAMAddr *this)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  sVar1 = linearize(this);
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 0xf0; lVar3 = lVar3 + 8) {
    uVar4 = *(ulong *)((long)MemConfig.ADDR_MTX + lVar3) & sVar1;
    uVar5 = (uint)(uVar4 >> 0x20) ^ (uint)uVar4;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
    uVar2 = (ulong)((POPCOUNT((byte)uVar5 ^ (byte)(uVar5 >> 8)) & 1U) != 0) + uVar2 * 2;
  }
  return (void *)(uVar2 | base_msb);
}

Assistant:

void *DRAMAddr::to_virt() const {
  size_t res = 0;
  size_t l = this->linearize();
  for (unsigned long i : MemConfig.ADDR_MTX) {
    res <<= 1ULL;
    res |= (size_t) __builtin_parityl(l & i);
  }
  void *v_addr = (void *) (base_msb | res);
  return v_addr;
}